

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> * __thiscall
capnp::anon_unknown_0::MembraneHook::whenMoreResolved
          (Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *__return_storage_ptr__,
          MembraneHook *this)

{
  ClientHook *pCVar1;
  undefined8 *puVar2;
  PromiseNode *pPVar3;
  ClientHook *pCVar4;
  TransformPromiseNodeBase *pTVar5;
  Own<kj::_::ImmediatePromiseNode<kj::Own<capnp::ClientHook>_>_> OVar6;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar7;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> promise;
  NullableValue<kj::Promise<void>_> r;
  undefined4 local_88;
  undefined4 uStack_84;
  Own<kj::_::PromiseNode> OStack_80;
  kj local_70 [8];
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Own<capnp::ClientHook> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  PromiseNode *pPStack_28;
  
  pCVar1 = (this->resolved).ptr.ptr;
  if (pCVar1 != (ClientHook *)0x0) {
    (*((this->resolved).ptr.ptr)->_vptr_ClientHook[4])(&local_48);
    OVar6 = kj::
            heap<kj::_::ImmediatePromiseNode<kj::Own<capnp::ClientHook>>,kj::Own<capnp::ClientHook>>
                      ((kj *)&local_88,&local_48);
    pCVar4 = local_48.ptr;
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined4 *)&(__return_storage_ptr__->ptr).field_1 = local_88;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 4) = uStack_84;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = OStack_80.disposer._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) = OStack_80.disposer._4_4_;
    if (local_48.ptr != (ClientHook *)0x0) {
      local_48.ptr = (ClientHook *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,pCVar4->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook,
                 OVar6.ptr);
    }
    if (pCVar1 != (ClientHook *)0x0) {
      return __return_storage_ptr__;
    }
  }
  (*((this->inner).ptr)->_vptr_ClientHook[3])(local_70);
  local_88 = CONCAT31(local_88._1_3_,local_70[0]);
  if (local_70[0] == (kj)0x1) {
    OStack_80.disposer._0_4_ = local_68.disposer._0_4_;
    OStack_80.disposer._4_4_ = local_68.disposer._4_4_;
    OStack_80.ptr = local_68.ptr;
    local_68.ptr = (PromiseNode *)0x0;
    (*((this->policy).ptr)->_vptr_MembranePolicy[3])(&local_38);
    local_70[0] = local_38._0_1_;
    if (local_38._0_1_ == (kj)0x1) {
      local_68.disposer = (Disposer *)CONCAT44(uStack_2c,uStack_30);
      local_68.ptr = pPStack_28;
      pPStack_28 = (PromiseNode *)0x0;
    }
    if (local_38._0_1_ == (kj)0x1) {
      pTVar5 = (TransformPromiseNodeBase *)operator_new(0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar5,&local_68,
                 kj::_::
                 TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++:447:51),_kj::_::PropagateException>
                 ::anon_class_1_0_00000001_for_func::operator());
      (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00643a00;
      local_58.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda()#1},kj::_::PropagateException>>
            ::instance;
      local_58.ptr = (PromiseNode *)pTVar5;
      OVar7 = kj::
              heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                        ((kj *)&local_38,&OStack_80,&local_58);
      pPVar3 = OStack_80.ptr;
      puVar2 = (undefined8 *)CONCAT44(OStack_80.disposer._4_4_,OStack_80.disposer._0_4_);
      OStack_80.disposer._0_4_ = local_38;
      OStack_80.disposer._4_4_ = uStack_34;
      OStack_80.ptr = (PromiseNode *)CONCAT44(uStack_2c,uStack_30);
      if (pPVar3 != (PromiseNode *)0x0) {
        (**(code **)*puVar2)
                  (puVar2,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode,OVar7.ptr
                  );
      }
      pPVar3 = local_58.ptr;
      if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
        local_58.ptr = (PromiseNode *)0x0;
        (**(local_58.disposer)->_vptr_Disposer)
                  (local_58.disposer,
                   ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
      }
    }
    pPVar3 = local_68.ptr;
    if ((local_70[0] == (kj)0x1) && (local_68.ptr != (PromiseNode *)0x0)) {
      local_68.ptr = (PromiseNode *)0x0;
      (**(local_68.disposer)->_vptr_Disposer)
                (local_68.disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode)
      ;
    }
    pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,&OStack_80,
               kj::_::
               TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::ClientHook>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++:452:28),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00643a88;
    pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::ClientHook>,capnp::(anonymous_namespace)::MembraneHook::whenMoreResolved()::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::_::PropagateException>>
          ::instance;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)pTVar5;
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  pPVar3 = OStack_80.ptr;
  if ((local_88._0_1_ == (kj)0x1) && (OStack_80.ptr != (PromiseNode *)0x0)) {
    OStack_80.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(OStack_80.disposer._4_4_,OStack_80.disposer._0_4_))
              ((undefined8 *)CONCAT44(OStack_80.disposer._4_4_,OStack_80.disposer._0_4_),
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_MAYBE(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->get()->addRef());
    }

    KJ_IF_MAYBE(promise, inner->whenMoreResolved()) {
      KJ_IF_MAYBE(r, policy->onRevoked()) {
        *promise = promise->exclusiveJoin(r->then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise->then([this](kj::Own<ClientHook>&& newInner) {
        kj::Own<ClientHook> newResolved = wrap(*newInner, *policy, reverse);
        if (resolved == nullptr) {
          resolved = newResolved->addRef();
        }
        return newResolved;
      });
    }